

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int i;
  ulong uVar1;
  long lVar2;
  
  IM_DELETE<char>(this->Name);
  lVar2 = 0x30;
  for (uVar1 = 0; uVar1 != (uint)(this->ColumnsStorage).Size; uVar1 = uVar1 + 1) {
    ImVector<ImGuiColumnData>::~ImVector
              ((ImVector<ImGuiColumnData> *)((long)&((this->ColumnsStorage).Data)->ID + lVar2));
    lVar2 = lVar2 + 0x40;
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  ImVector<ImGuiColumnsSet>::~ImVector(&this->ColumnsStorage);
  ImVector<ImGuiStorage::Pair>::~ImVector(&(this->StateStorage).Data);
  ImVector<unsigned_int>::~ImVector(&this->IDStack);
  ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumnsSet();
}